

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::TypeMetaFunction::isSizeOfUnsizedType(TypeMetaFunction *this)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  bool local_32;
  Type local_30;
  TypeMetaFunction *local_18;
  TypeMetaFunction *this_local;
  
  bVar1 = false;
  local_32 = false;
  local_18 = this;
  if (this->operation == size) {
    pEVar3 = pool_ref<soul::AST::Expression>::operator->(&this->source);
    uVar2 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    local_32 = false;
    if ((uVar2 & 1) != 0) {
      getSourceType(&local_30,this);
      bVar1 = true;
      local_32 = Type::isUnsizedArray(&local_30);
    }
  }
  this_local._7_1_ = local_32;
  if (bVar1) {
    Type::~Type(&local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isSizeOfUnsizedType() const
        {
            return operation == Op::size && source->isResolved() && getSourceType().isUnsizedArray();
        }